

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O0

SEQNUM __thiscall FIX::SessionState::getNextTargetMsgSeqNum(SessionState *this)

{
  int iVar1;
  undefined4 extraout_var;
  Locker local_18;
  Locker l;
  SessionState *this_local;
  
  l.m_mutex = (Mutex *)this;
  Locker::Locker(&local_18,&this->m_mutex);
  iVar1 = (*this->m_pStore->_vptr_MessageStore[5])();
  Locker::~Locker(&local_18);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

EXCEPT(IOException) {
    Locker l(m_mutex);
    return m_pStore->getNextTargetMsgSeqNum();
  }